

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O0

int funchook_uninstall(funchook_t *funchook,int flags)

{
  uint uVar1;
  uint in_ESI;
  funchook_t *in_RDI;
  int rv;
  funchook_t *in_stack_00000018;
  
  funchook_log(in_RDI,"Enter funchook_uninstall(%p, 0x%x)\n",in_RDI,(ulong)in_ESI);
  uVar1 = funchook_uninstall_internal(in_stack_00000018,funchook._4_4_);
  funchook_log_end((funchook_t *)0x0,"Leave funchook_uninstall() => %d\n",(ulong)uVar1);
  return uVar1;
}

Assistant:

int funchook_uninstall(funchook_t *funchook, int flags)
{
    int rv;

    funchook_log(funchook, "Enter funchook_uninstall(%p, 0x%x)\n", funchook, flags);
    rv = funchook_uninstall_internal(funchook, flags);
    funchook_log_end(NULL, "Leave funchook_uninstall() => %d\n", rv);
    return rv;
}